

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Bitmask sqlite3WhereExprListUsage(WhereMaskSet *pMaskSet,ExprList *pList)

{
  ulong uVar1;
  int iVar2;
  ExprList_item *pEVar3;
  long lVar4;
  Bitmask BVar5;
  
  if ((pList == (ExprList *)0x0) || (iVar2 = pList->nExpr, iVar2 < 1)) {
    BVar5 = 0;
  }
  else {
    pEVar3 = pList->a;
    lVar4 = 0;
    BVar5 = 0;
    do {
      if (pEVar3->pExpr == (Expr *)0x0) {
        uVar1 = 0;
      }
      else {
        uVar1 = sqlite3WhereExprUsageNN(pMaskSet,pEVar3->pExpr);
        iVar2 = pList->nExpr;
      }
      BVar5 = BVar5 | uVar1;
      lVar4 = lVar4 + 1;
      pEVar3 = pEVar3 + 1;
    } while (lVar4 < iVar2);
  }
  return BVar5;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereExprListUsage(WhereMaskSet *pMaskSet, ExprList *pList){
  int i;
  Bitmask mask = 0;
  if( pList ){
    for(i=0; i<pList->nExpr; i++){
      mask |= sqlite3WhereExprUsage(pMaskSet, pList->a[i].pExpr);
    }
  }
  return mask;
}